

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O0

void __thiscall rsg::SwizzleOp::evaluate(SwizzleOp *this,ExecutionContext *execCtx)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  VariableType *pVVar3;
  ConstStridedValueAccess<64> local_70;
  ConstStridedValueAccess<64> local_60;
  StridedValueRead<64> local_50;
  uint local_40;
  int local_3c;
  int inElemNdx;
  int outElemNdx;
  ExecValueAccess outValue;
  ExecConstValueAccess inValue;
  ExecutionContext *execCtx_local;
  SwizzleOp *this_local;
  
  (*this->m_child->_vptr_Expression[4])(this->m_child,execCtx);
  iVar1 = (*this->m_child->_vptr_Expression[5])();
  outValue.super_ConstStridedValueAccess<64>.m_value = (Scalar *)CONCAT44(extraout_var,iVar1);
  pVVar3 = ValueRange::getType(&this->m_outValueRange);
  _inElemNdx = (ConstStridedValueAccess<64>)ValueStorage<64>::getValue(&this->m_value,pVVar3);
  local_3c = 0;
  while( true ) {
    iVar1 = local_3c;
    pVVar3 = ConstStridedValueAccess<64>::getType((ConstStridedValueAccess<64> *)&inElemNdx);
    iVar2 = VariableType::getNumElements(pVVar3);
    if (iVar2 <= iVar1) break;
    local_40 = (uint)this->m_swizzle[local_3c];
    local_60 = ConstStridedValueAccess<64>::component
                         ((ConstStridedValueAccess<64> *)
                          &outValue.super_ConstStridedValueAccess<64>.m_value,local_40);
    local_50 = ConstStridedValueAccess<64>::value(&local_60);
    local_70 = (ConstStridedValueAccess<64>)
               StridedValueAccess<64>::component((StridedValueAccess<64> *)&inElemNdx,local_3c);
    StridedValueAccess<64>::operator=((StridedValueAccess<64> *)&local_70,&local_50);
    local_3c = local_3c + 1;
  }
  return;
}

Assistant:

void SwizzleOp::evaluate (ExecutionContext& execCtx)
{
	m_child->evaluate(execCtx);

	ExecConstValueAccess	inValue		= m_child->getValue();
	ExecValueAccess			outValue	= m_value.getValue(m_outValueRange.getType());

	for (int outElemNdx = 0; outElemNdx < outValue.getType().getNumElements(); outElemNdx++)
	{
		int inElemNdx = m_swizzle[outElemNdx];
		outValue.component(outElemNdx) = inValue.component(inElemNdx).value();
	}
}